

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O3

ktx_error_code_e
ktxTexture2_GetImageOffset
          (ktxTexture2 *This,ktx_uint32_t level,ktx_uint32_t layer,ktx_uint32_t faceSlice,
          ktx_size_t *pOffset)

{
  uint uVar1;
  ktx_size_t kVar2;
  ktx_error_code_e kVar3;
  
  if (This == (ktxTexture2 *)0x0) {
    kVar3 = KTX_INVALID_VALUE;
  }
  else {
    kVar3 = KTX_INVALID_OPERATION;
    if (((level < This->numLevels) && (layer < This->numLayers)) &&
       (This->supercompressionScheme == KTX_SS_BEGIN_RANGE)) {
      if (This->isCubemap == true) {
        uVar1 = This->numFaces;
      }
      else {
        uVar1 = This->baseDepth >> ((byte)level & 0x1f);
        uVar1 = uVar1 + (uVar1 == 0);
      }
      if (faceSlice < uVar1) {
        *pOffset = This->_private->_levelIndex[level].byteOffset;
        if (layer != 0) {
          kVar2 = ktxTexture_layerSize((ktxTexture *)This,level,KTX_FORMAT_VERSION_TWO);
          *pOffset = *pOffset + layer * kVar2;
        }
        kVar3 = KTX_SUCCESS;
        if (faceSlice != 0) {
          kVar2 = ktxTexture_calcImageSize((ktxTexture *)This,level,KTX_FORMAT_VERSION_TWO);
          *pOffset = *pOffset + faceSlice * kVar2;
        }
      }
    }
  }
  return kVar3;
}

Assistant:

KTX_error_code
ktxTexture2_GetImageOffset(ktxTexture2* This, ktx_uint32_t level,
                          ktx_uint32_t layer, ktx_uint32_t faceSlice,
                          ktx_size_t* pOffset)
{
    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (level >= This->numLevels || layer >= This->numLayers)
        return KTX_INVALID_OPERATION;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    if (This->isCubemap) {
        if (faceSlice >= This->numFaces)
            return KTX_INVALID_OPERATION;
    } else {
        ktx_uint32_t maxSlice = MAX(1, This->baseDepth >> level);
        if (faceSlice >= maxSlice)
            return KTX_INVALID_OPERATION;
    }

    // Get the offset of the start of the level.
    *pOffset = ktxTexture2_levelDataOffset(This, level);

    // All layers, faces & slices within a level are the same size.
    if (layer != 0) {
        ktx_size_t layerSize;
        layerSize = ktxTexture_layerSize(ktxTexture(This), level,
                                         KTX_FORMAT_VERSION_TWO);
        *pOffset += layer * layerSize;
    }
    if (faceSlice != 0) {
        ktx_size_t imageSize;
        imageSize = ktxTexture2_GetImageSize(This, level);
        *pOffset += faceSlice * imageSize;
    }
    return KTX_SUCCESS;
}